

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

cmFileLockResult __thiscall
cmFileLockPool::LockFileScope(cmFileLockPool *this,string *filename,unsigned_long timeoutSec)

{
  pointer ppSVar1;
  bool bVar2;
  cmFileLockResult cVar3;
  
  bVar2 = IsAlreadyLocked(this,filename);
  if (bVar2) {
    cVar3 = cmFileLockResult::MakeAlreadyLocked();
    return cVar3;
  }
  ppSVar1 = (this->FileScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->FileScopes).
      super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>.
      _M_impl.super__Vector_impl_data._M_start != ppSVar1) {
    cVar3 = ScopePool::Lock(ppSVar1[-1],filename,timeoutSec);
    return cVar3;
  }
  __assert_fail("!this->FileScopes.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmFileLockPool.cxx"
                ,0x3f,
                "cmFileLockResult cmFileLockPool::LockFileScope(const std::string &, unsigned long)"
               );
}

Assistant:

cmFileLockResult cmFileLockPool::LockFileScope(const std::string& filename,
                                               unsigned long timeoutSec)
{
  if (this->IsAlreadyLocked(filename)) {
    return cmFileLockResult::MakeAlreadyLocked();
  }
  assert(!this->FileScopes.empty());
  return this->FileScopes.back()->Lock(filename, timeoutSec);
}